

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgenericitemmodel.cpp
# Opt level: O3

bool __thiscall
QGenericItemModel::insertRows(QGenericItemModel *this,int row,int count,QModelIndex *parent)

{
  long in_FS_OFFSET;
  bool ret;
  int local_38;
  int local_34;
  QModelIndex *local_30;
  undefined1 *local_28;
  int *local_20;
  undefined1 local_11;
  long local_10;
  
  local_28 = (undefined1 *)&local_38;
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = &local_34;
  local_11 = 0;
  local_38 = count;
  local_34 = row;
  local_30 = parent;
  (**(code **)(*(long *)(this + 0x10) + 8))(7,*(long *)(this + 0x10),&local_11,&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return (bool)local_11;
  }
  __stack_chk_fail();
}

Assistant:

bool QGenericItemModel::insertRows(int row, int count, const QModelIndex &parent)
{
    return impl->call<bool>(QGenericItemModelImplBase::InsertRows, row, count, parent);
}